

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Costs.cpp
# Opt level: O0

void __thiscall Costs::linReg(Costs *this,double *coeff,double *gtT,uint t,uint n)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  uint local_74;
  double dStack_70;
  uint i_1;
  double residuMin;
  double residuMax;
  double intercept;
  double slope;
  double sum3;
  double prod3;
  double dStack_38;
  uint i;
  double sum_igtT;
  double sum_gtT;
  uint n_local;
  uint t_local;
  double *gtT_local;
  double *coeff_local;
  Costs *this_local;
  
  sum_igtT = 0.0;
  dStack_38 = 0.0;
  for (prod3._4_4_ = t + 2; prod3._4_4_ < n + 1; prod3._4_4_ = prod3._4_4_ + 1) {
    sum_igtT = sum_igtT + gtT[prod3._4_4_];
    dStack_38 = (double)prod3._4_4_ * gtT[prod3._4_4_] + dStack_38;
  }
  uVar1 = n - t;
  dVar2 = (double)uVar1 * (double)(uVar1 - 1) * (double)(uVar1 + 1);
  dVar3 = (double)(n + 1 + t);
  dVar4 = ((dVar3 * -6.0) / dVar2) * sum_igtT + (12.0 / dVar2) * dStack_38;
  dVar2 = (1.0 / ((double)(n - t) * 1.0) + (dVar3 * 3.0) / dVar2) * sum_igtT +
          -(((dVar3 * 6.0) / dVar2) * dStack_38);
  residuMin = 0.0;
  dStack_70 = 0.0;
  for (local_74 = t + 1; local_74 < n + 1; local_74 = local_74 + 1) {
    if (residuMin < gtT[local_74] - (dVar4 * (double)local_74 + dVar2)) {
      residuMin = gtT[local_74] - (dVar4 * (double)local_74 + dVar2);
    }
    if (gtT[local_74] - (dVar4 * (double)local_74 + dVar2) < dStack_70) {
      dStack_70 = gtT[local_74] - (dVar4 * (double)local_74 + dVar2);
    }
  }
  *coeff = dVar4;
  coeff[1] = dVar4;
  coeff[2] = dVar2 + dStack_70;
  coeff[3] = dVar2 + residuMin;
  return;
}

Assistant:

void Costs::linReg(double* coeff, double *gtT, unsigned int t, unsigned int n)
{
  double sum_gtT = 0;
  double sum_igtT = 0;
  for(unsigned int i = t + 2; i < n + 1; i++) // 0 in t + 1
  {
    sum_gtT = sum_gtT + gtT[i];
    sum_igtT = sum_igtT + i * gtT[i];
  }
  double prod3 = 1.0*(n-t)*(n-t-1)*(n-t+1);
  double sum3 = 1.0*(n+t+1);

  double slope = (-6*sum3/prod3)*sum_gtT + (12/prod3)*sum_igtT;
  double intercept =((1/(1.0*(n-t))) + 3*sum3/prod3)*sum_gtT - (6*sum3/prod3)*sum_igtT;

  double residuMax = 0;
  double residuMin = 0;

  for(unsigned int i = t + 1; i < n + 1; i++) // 0 in t + 1
  {
    if(gtT[i] - (slope*i + intercept) > residuMax){residuMax = gtT[i] - (slope*i + intercept);}
    if(gtT[i] - (slope*i + intercept) < residuMin){residuMin = gtT[i] - (slope*i + intercept);}
  }

  ///matrix of coefficients: Ap, Am, Gp, Gm
  coeff[0] = slope;
  coeff[1] = slope;
  coeff[2] = intercept + residuMin;
  coeff[3] = intercept + residuMax;
}